

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_start_stream(ps_decoder_t *ps)

{
  ps_decoder_t *ps_local;
  
  if (ps->acmod == (acmod_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else if (ps->acmod->fe == (fe_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else if (ps->acmod->fe->noise_stats == (noise_stats_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else {
    fe_reset_noisestats(ps->acmod->fe->noise_stats);
    ps_local._4_4_ = 0;
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_start_stream(ps_decoder_t *ps)
{
    if (ps->acmod == NULL)
        return -1;
    if (ps->acmod->fe == NULL)
        return -1;
    if (ps->acmod->fe->noise_stats == NULL)
        return -1;
    fe_reset_noisestats(ps->acmod->fe->noise_stats);
    return 0;
}